

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2boolean_operation.cc
# Opt level: O2

EdgeCrossingResult * __thiscall
S2BooleanOperation::Impl::CrossingProcessor::ProcessEdgeCrossings
          (EdgeCrossingResult *__return_storage_ptr__,CrossingProcessor *this,ShapeEdgeId a_id,
          Edge *a,CrossingIterator *it)

{
  S2Point *this_00;
  S2Point *b_00;
  byte bVar1;
  IndexCrossing *pIVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  int iVar11;
  ShapeEdgeId SVar12;
  int iVar13;
  int local_a8;
  int local_9c;
  int local_84;
  undefined1 local_70 [9];
  undefined7 uStack_67;
  Edge b;
  
  __return_storage_ptr__->a0_crossings = 0;
  __return_storage_ptr__->a1_crossings = 0;
  __return_storage_ptr__->interior_crossings = 0;
  __return_storage_ptr__->matches_polyline = false;
  __return_storage_ptr__->matches_polygon = false;
  __return_storage_ptr__->matches_sibling = false;
  __return_storage_ptr__->a0_matches_polyline = false;
  __return_storage_ptr__->a0_matches_polyline = false;
  __return_storage_ptr__->a1_matches_polyline = false;
  __return_storage_ptr__->a0_matches_polygon = false;
  __return_storage_ptr__->a1_matches_polygon = false;
  if (((it->it_)._M_current)->a == a_id) {
    this_00 = &a->v1;
    bVar4 = false;
    b_00 = &b.v1;
    bVar3 = false;
    bVar10 = false;
    bVar9 = false;
    bVar7 = false;
    bVar8 = false;
    bVar6 = false;
    local_a8 = 0;
    local_9c = 0;
    local_84 = 0;
    SVar12 = a_id;
    while (SVar12 == a_id) {
      if (it->b_dimension_ != 0) {
        CrossingIterator::b_edge(&b,it);
        pIVar2 = (it->it_)._M_current;
        bVar1 = pIVar2->field_0x10;
        if ((bVar1 & 1) == 0) {
          if (it->b_dimension_ == 1) {
            if (this->a_dimension_ != 2) {
              bVar5 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator==
                                ((BasicVector<Vector3,_double,_3UL> *)a,&b.v0);
              if (((bVar5) &&
                  (bVar5 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::
                           operator==((BasicVector<Vector3,_double,_3UL> *)this_00,b_00), bVar5)) ||
                 ((bVar5 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::
                           operator==((BasicVector<Vector3,_double,_3UL> *)a,b_00), bVar5 &&
                  (bVar5 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::
                           operator==((BasicVector<Vector3,_double,_3UL> *)this_00,&b.v0), bVar5))))
              {
                bVar6 = true;
              }
              bVar5 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator==
                                ((BasicVector<Vector3,_double,_3UL> *)a,&b.v0);
              if (((bVar5) ||
                  (bVar5 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::
                           operator==((BasicVector<Vector3,_double,_3UL> *)a,b_00), bVar5)) &&
                 (bVar5 = PolylineEdgeContainsVertex(this,&a->v0,it), bVar5)) {
                bVar3 = true;
              }
              bVar5 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator==
                                ((BasicVector<Vector3,_double,_3UL> *)this_00,&b.v0);
              if (((bVar5) ||
                  (bVar5 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::
                           operator==((BasicVector<Vector3,_double,_3UL> *)this_00,b_00), bVar5)) &&
                 (bVar5 = PolylineEdgeContainsVertex(this,this_00,it), bVar5)) {
                bVar4 = true;
              }
            }
          }
          else {
            if (it->b_dimension_ != 2) {
              __return_storage_ptr__->matches_sibling = bVar8;
              __return_storage_ptr__->matches_polygon = bVar7;
              __return_storage_ptr__->a0_matches_polygon = bVar9;
              __return_storage_ptr__->a1_matches_polygon = bVar10;
              __return_storage_ptr__->a0_matches_polyline = bVar3;
              __return_storage_ptr__->a1_matches_polyline = bVar4;
              __return_storage_ptr__->interior_crossings = local_84;
              __return_storage_ptr__->a1_crossings = local_9c;
              __return_storage_ptr__->a0_crossings = local_a8;
              __return_storage_ptr__->matches_polyline = bVar6;
              S2LogMessage::S2LogMessage
                        ((S2LogMessage *)local_70,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2boolean_operation.cc"
                         ,0x667,kFatal,(ostream *)&std::cerr);
              std::operator<<((ostream *)CONCAT71(uStack_67,local_70[8]),
                              "Check failed: (2) == (it->b_dimension()) ");
              abort();
            }
            bVar5 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator==
                              ((BasicVector<Vector3,_double,_3UL> *)a,&b.v0);
            if ((bVar5) &&
               (bVar5 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator==
                                  ((BasicVector<Vector3,_double,_3UL> *)this_00,b_00), bVar5)) {
              local_a8 = local_a8 + 1;
              bVar7 = true;
            }
            else {
              bVar5 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator==
                                ((BasicVector<Vector3,_double,_3UL> *)a,b_00);
              if ((bVar5) &&
                 (bVar5 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator==
                                    ((BasicVector<Vector3,_double,_3UL> *)this_00,&b.v0), bVar5)) {
                local_a8 = local_a8 + 1;
                bVar8 = true;
              }
              else if ((((it->it_)._M_current)->field_0x10 & 4) != 0) {
                bVar5 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator==
                                  ((BasicVector<Vector3,_double,_3UL> *)a,&b.v0);
                if ((bVar5) ||
                   (bVar5 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::
                            operator==((BasicVector<Vector3,_double,_3UL> *)a,b_00), bVar5)) {
                  local_a8 = local_a8 + 1;
                }
                else {
                  local_9c = local_9c + 1;
                }
              }
            }
            bVar5 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator==
                              ((BasicVector<Vector3,_double,_3UL> *)a,&b.v0);
            if ((bVar5) ||
               (bVar5 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator==
                                  ((BasicVector<Vector3,_double,_3UL> *)a,b_00), bVar5)) {
              bVar9 = true;
            }
            bVar5 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator==
                              ((BasicVector<Vector3,_double,_3UL> *)this_00,&b.v0);
            if ((bVar5) ||
               (bVar5 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator==
                                  ((BasicVector<Vector3,_double,_3UL> *)this_00,b_00), bVar5)) {
              bVar10 = true;
            }
          }
        }
        else {
          iVar13 = it->b_dimension_;
          if (iVar13 < this->a_dimension_) {
LAB_001e659e:
            iVar11 = 1;
            if (iVar13 == 1) goto LAB_001e65a6;
          }
          else {
            if ((iVar13 != 1) || (this->invert_b_ == this->invert_result_)) {
              local_70[8] = (bool)(bVar1 >> 1 & 1);
              local_70._4_4_ = (pIVar2->b).edge_id;
              local_70._0_4_ = (this->b_region_id_ & 1U) + it->b_shape_id_ * 2;
              AddCrossing(this,(SourceEdgeCrossing *)local_70);
              iVar13 = it->b_dimension_;
              goto LAB_001e659e;
            }
LAB_001e65a6:
            iVar11 = 2;
          }
          local_84 = local_84 + iVar11;
        }
      }
      CrossingIterator::Next(it);
      SVar12 = ((it->it_)._M_current)->a;
    }
    __return_storage_ptr__->matches_sibling = bVar8;
    __return_storage_ptr__->matches_polygon = bVar7;
    __return_storage_ptr__->a0_matches_polygon = bVar9;
    __return_storage_ptr__->a1_matches_polygon = bVar10;
    __return_storage_ptr__->a0_matches_polyline = bVar3;
    __return_storage_ptr__->a1_matches_polyline = bVar4;
    __return_storage_ptr__->interior_crossings = local_84;
    __return_storage_ptr__->a1_crossings = local_9c;
    __return_storage_ptr__->a0_crossings = local_a8;
    __return_storage_ptr__->matches_polyline = bVar6;
  }
  return __return_storage_ptr__;
}

Assistant:

EdgeCrossingResult()
      : matches_polyline(false), matches_polygon(false), matches_sibling(false),
        a0_matches_polyline(false), a1_matches_polyline(false),
        a0_matches_polygon(false), a1_matches_polygon(false),
        a0_crossings(0), a1_crossings(0), interior_crossings(0) {
  }